

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcActor::IfcActor(IfcActor *this)

{
  IfcActor *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xf0,"IfcActor");
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__00f7a6c8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcActor,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcActor,_1UL> *)
             &(this->super_IfcObject).field_0xd0,&PTR_construction_vtable_24__00f7a740);
  *(undefined8 *)&this->super_IfcObject = 0xf7a610;
  *(undefined8 *)&this->field_0xf0 = 0xf7a6b0;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0xf7a638;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xf7a660;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0xf7a688;
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)
             &(this->super_IfcObject).field_0xe0);
  return;
}

Assistant:

IfcActor() : Object("IfcActor") {}